

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

RealType __thiscall
QuantLib::Problem::computeGradientNormValue
          (Problem *this,DynamicVector<double,_std::allocator<double>_> *grad_f)

{
  double dVar1;
  RealType dot;
  
  dVar1 = OpenMD::DynamicVector<double,_std::allocator<double>_>::lengthSquare
                    ((DynamicVector<double,_std::allocator<double>_> *)0x2660d8);
  return dVar1;
}

Assistant:

RealType Problem::computeGradientNormValue(DynamicVector<RealType>& grad_f) {
    RealType dot = grad_f.lengthSquare();
    return dot;
  }